

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

bool Assimp::SceneCombiner::FindNameMatch
               (aiString *name,
               vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *input,uint cur)

{
  pointer pSVar1;
  _Base_ptr p_Var2;
  uint32_t uVar3;
  ulong uVar4;
  long lVar5;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  uVar9 = 0;
  uVar3 = SuperFastHash(name->data,name->length,0);
  pSVar1 = (input->super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(input->
                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
  bVar11 = lVar5 != 0;
  if (bVar11) {
    uVar4 = (lVar5 >> 5) * -0x5555555555555555;
    do {
      if ((uint)uVar9 != cur) {
        p_Var6 = (_Rb_tree_header *)((long)&pSVar1[uVar9].hashes._M_t._M_impl + 8);
        p_Var7 = (_Base_ptr)p_Var6;
        for (p_Var2 = *(_Base_ptr *)((long)&pSVar1[uVar9].hashes._M_t._M_impl + 0x10);
            (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar10]
            ) {
          bVar10 = (uint)*(size_t *)(p_Var2 + 1) < uVar3;
          if (!bVar10) {
            p_Var7 = p_Var2;
          }
        }
        p_Var8 = p_Var6;
        if (((_Rb_tree_header *)p_Var7 != p_Var6) &&
           (p_Var8 = (_Rb_tree_header *)p_Var7,
           uVar3 < (uint)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
          p_Var8 = p_Var6;
        }
        if (p_Var8 != p_Var6) {
          return bVar11;
        }
      }
      uVar9 = (ulong)((uint)uVar9 + 1);
      bVar10 = uVar4 - uVar9 != 0;
      bVar11 = uVar9 <= uVar4 && bVar10;
    } while (uVar9 <= uVar4 && bVar10);
  }
  return bVar11;
}

Assistant:

bool SceneCombiner::FindNameMatch(const aiString& name, std::vector<SceneHelper>& input, unsigned int cur) {
    const unsigned int hash = SuperFastHash(name.data, static_cast<uint32_t>(name.length));

    // Check whether we find a positive match in one of the given sets
    for (unsigned int i = 0; i < input.size(); ++i) {
        if (cur != i && input[i].hashes.find(hash) != input[i].hashes.end()) {
            return true;
        }
    }
    return false;
}